

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O1

int * Saig_ManBmcMapping(Gia_ManBmc_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int *piVar4;
  
  iVar1 = pObj->Id;
  if (-1 < (long)iVar1) {
    iVar2 = p->vMapping->nSize;
    if (iVar1 < iVar2) {
      piVar4 = p->vMapping->pArray;
      uVar3 = piVar4[iVar1];
      if ((ulong)uVar3 == 0) {
        piVar4 = (int *)0x0;
      }
      else {
        if (((int)uVar3 < 0) || (iVar2 <= (int)uVar3)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar4 = piVar4 + uVar3;
      }
      return piVar4;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

static inline int * Saig_ManBmcMapping( Gia_ManBmc_t * p, Aig_Obj_t * pObj )
{
    if ( Vec_IntEntry(p->vMapping, Aig_ObjId(pObj)) == 0 )
        return NULL;
    return Vec_IntEntryP( p->vMapping, Vec_IntEntry(p->vMapping, Aig_ObjId(pObj)) );
}